

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_tvptr(ASMState *as,Reg dest,IRRef ref,MSize mode)

{
  MCode *pMVar1;
  byte bVar2;
  Reg RVar3;
  uint uVar4;
  x86Op xVar5;
  IRIns *pIVar6;
  bool bVar7;
  TValue k;
  TValue local_30;
  
  if ((mode & 1) != 0) {
    pIVar6 = as->ir + ref;
    if (((pIVar6->field_1).t.irt & 0x1f) == 0xe) {
      if ((char)((mode & 2) >> 1) == '\0' && ref < 0x8000) {
        pIVar6 = pIVar6 + 1;
        goto LAB_00140b74;
      }
      RVar3 = (Reg)(pIVar6->field_1).r;
      if ((char)(pIVar6->field_1).r < '\0') {
        RVar3 = ra_allocref(as,ref,0xffff0000);
      }
      bVar2 = (byte)RVar3 & 0x1f;
      as->weakset = as->weakset & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
      xVar5 = XO_MOVSDto;
    }
    else if (ref < 0x8000) {
      lj_ir_kvalue(as->J->L,&local_30,pIVar6);
      pMVar1 = as->mcp;
      *(uint32_t *)(pMVar1 + -4) = local_30.field_4.it;
      as->mcp = pMVar1 + -4;
      emit_rmro(as,XO_MOVmi,0,dest,4);
      pMVar1 = as->mcp;
      *(int32_t *)(pMVar1 + -4) = local_30.field_4.i;
      as->mcp = pMVar1 + -4;
      xVar5 = XO_MOVmi;
      RVar3 = 0;
    }
    else {
      RVar3 = (Reg)(pIVar6->field_1).r;
      if ((char)(pIVar6->field_1).r < '\0') {
        RVar3 = ra_allocref(as,ref,~(1 << (dest & 0x1f)) & 0xbfef);
      }
      bVar2 = (byte)RVar3 & 0x1f;
      as->weakset = as->weakset & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
      uVar4 = (pIVar6->field_1).t.irt & 0x1f;
      pMVar1 = as->mcp;
      bVar7 = (0x605fd9U >> uVar4 & 1) != 0;
      *(uint *)(pMVar1 + -4) = ~uVar4 << 0xf;
      as->mcp = pMVar1 + -4;
      if (bVar7) {
        xVar5 = XO_ARITHi;
      }
      else {
        xVar5 = XO_MOVmi;
      }
      emit_rmro(as,xVar5,(uint)bVar7,dest,4);
      uVar4._0_2_ = *(IROpT *)((long)pIVar6 + 4);
      uVar4._2_2_ = *(IRRef1 *)((long)pIVar6 + 6);
      RVar3 = -(uint)((0x605fd9U >> (uVar4 & 0x1f) & 1) != 0) & 0x80200 | RVar3;
      xVar5 = XO_MOVto;
    }
    emit_rmro(as,xVar5,RVar3,dest,0);
  }
  pIVar6 = (IRIns *)&as->J[-1].penalty[0x31].val;
LAB_00140b74:
  emit_loadu64(as,dest,(uint64_t)pIVar6);
  return;
}

Assistant:

static void asm_tvptr(ASMState *as, Reg dest, IRRef ref, MSize mode)
{
  if ((mode & IRTMPREF_IN1)) {
    IRIns *ir = IR(ref);
    if (irt_isnum(ir->t)) {
      if (irref_isk(ref) && !(mode & IRTMPREF_OUT1)) {
	/* Use the number constant itself as a TValue. */
	emit_loada(as, dest, ir_knum(ir));
	return;
      }
      emit_rmro(as, XO_MOVSDto, ra_alloc1(as, ref, RSET_FPR), dest, 0);
    } else {
#if LJ_GC64
      if (irref_isk(ref)) {
	TValue k;
	lj_ir_kvalue(as->J->L, &k, ir);
	emit_movmroi(as, dest, 4, k.u32.hi);
	emit_movmroi(as, dest, 0, k.u32.lo);
      } else {
	/* TODO: 64 bit store + 32 bit load-modify-store is suboptimal. */
	Reg src = ra_alloc1(as, ref, rset_exclude(RSET_GPR, dest));
	if (irt_is64(ir->t)) {
	  emit_u32(as, irt_toitype(ir->t) << 15);
	  emit_rmro(as, XO_ARITHi, XOg_OR, dest, 4);
	} else {
	  emit_movmroi(as, dest, 4, (irt_toitype(ir->t) << 15));
	}
	emit_movtomro(as, REX_64IR(ir, src), dest, 0);
      }
#else
      if (!irref_isk(ref)) {
	Reg src = ra_alloc1(as, ref, rset_exclude(RSET_GPR, dest));
	emit_movtomro(as, REX_64IR(ir, src), dest, 0);
      } else if (!irt_ispri(ir->t)) {
	emit_movmroi(as, dest, 0, ir->i);
      }
      if (!(LJ_64 && irt_islightud(ir->t)))
	emit_movmroi(as, dest, 4, irt_toitype(ir->t));
#endif
    }
  }
  emit_loada(as, dest, &J2G(as->J)->tmptv); /* g->tmptv holds the TValue(s). */
}